

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O2

OceanWave * InitializeWave(double SR,float attackInSeconds,float maxLevel,float positionLeftRight)

{
  int iVar1;
  OceanWave *pink;
  uint numRows;
  float fVar2;
  float extraout_XMM0_Db;
  float in_XMM1_Db;
  uint in_XMM2_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar3 [16];
  
  pink = (OceanWave *)PaUtil_AllocateMemory(0x250);
  if (pink != (OceanWave *)0x0) {
    InitializePinkNoise((PinkNoise *)pink,InitializeWave::lastNoOfRows);
    do {
      iVar1 = rand();
      numRows = (iVar1 << 3) / 0x7fffffff + 0xc;
    } while (numRows == InitializeWave::lastNoOfRows);
    InitializePinkNoise(&pink->wave_right,numRows);
    InitializeWave::lastNoOfRows = numRows;
    pink->wave_envelope_state = State_kAttack;
    pink->wave_envelope_level = 0.0;
    auVar4._4_4_ = in_XMM2_Db;
    auVar4._0_4_ = maxLevel;
    pink->wave_envelope_max_level = maxLevel;
    auVar4._8_4_ = in_XMM2_Db;
    auVar4._12_4_ = in_XMM2_Db ^ 0x80000000;
    auVar3._8_8_ = auVar4._8_8_;
    auVar3._0_8_ = CONCAT44(maxLevel,maxLevel) ^ 0x8000000000000000;
    auVar5._4_4_ = (float)SR * attackInSeconds * 4.0;
    auVar5._0_4_ = (float)SR * attackInSeconds;
    auVar5._8_4_ = extraout_XMM0_Db * in_XMM1_Db;
    auVar5._12_4_ = extraout_XMM0_Db * 0.0;
    auVar5 = divps(auVar3,auVar5);
    pink->wave_attack_incr = (float)(int)auVar5._0_8_;
    pink->wave_decay_incr = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
    fVar2 = 1.0 - positionLeftRight;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    pink->wave_pan_left = fVar2;
    if (positionLeftRight < 0.0) {
      fVar2 = sqrtf(positionLeftRight);
    }
    else {
      fVar2 = SQRT(positionLeftRight);
    }
    pink->wave_pan_right = fVar2;
  }
  return pink;
}

Assistant:

OceanWave* InitializeWave(double SR, float attackInSeconds, float maxLevel, float positionLeftRight)
{
    OceanWave* wave = NULL;
    static unsigned lastNoOfRows = 12;
    unsigned newNoOfRows;

    wave = (OceanWave*)PaUtil_AllocateMemory(sizeof(OceanWave));
    if (wave != NULL)
    {
        InitializePinkNoise(&wave->wave_left, lastNoOfRows);
        while ((newNoOfRows = NEW_ROW_SIZE) == lastNoOfRows);
        InitializePinkNoise(&wave->wave_right, newNoOfRows);
        lastNoOfRows = newNoOfRows;

        wave->wave_envelope_state = State_kAttack;
        wave->wave_envelope_level = 0.f;
        wave->wave_envelope_max_level = maxLevel;
        wave->wave_attack_incr = wave->wave_envelope_max_level / (attackInSeconds * (float)SR);
        wave->wave_decay_incr = - wave->wave_envelope_max_level / (attackInSeconds * 4 * (float)SR);

        wave->wave_pan_left = sqrtf(1.0f - positionLeftRight);
        wave->wave_pan_right = sqrtf(positionLeftRight);
    }
    return wave;
}